

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O1

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::makeBrOnCast<wasm::WATParser::(anonymous_namespace)::ParseDefsCtx>
          (Result<wasm::WATParser::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          optional<wasm::Type> castType,bool onFail)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string local_68;
  Err local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"unimplemented instruction","",
             castType.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._M_payload,
             castType.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._8_8_);
  ParseInput::err(&local_48,&ctx->in,&local_68);
  puVar1 = (undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                   super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x10);
  *(undefined8 **)
   &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
    super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
    super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
    super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
    super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> = puVar1;
  paVar2 = &local_48.msg.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.msg._M_dataplus._M_p == paVar2) {
    *puVar1 = CONCAT71(local_48.msg.field_2._M_allocated_capacity._1_7_,
                       local_48.msg.field_2._M_local_buf[0]);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x18) =
         local_48.msg.field_2._8_8_;
  }
  else {
    *(pointer *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> =
         local_48.msg._M_dataplus._M_p;
    *(ulong *)((long)&(__return_storage_ptr__->val).
                      super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x10
              ) = CONCAT71(local_48.msg.field_2._M_allocated_capacity._1_7_,
                           local_48.msg.field_2._M_local_buf[0]);
  }
  *(size_type *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 8) =
       local_48.msg._M_string_length;
  local_48.msg._M_string_length = 0;
  local_48.msg.field_2._M_local_buf[0] = '\0';
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) = '\x01';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    local_48.msg._M_dataplus._M_p = (pointer)paVar2;
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::InstrT>
makeBrOnCast(Ctx& ctx, Index pos, std::optional<Type> castType, bool onFail) {
  return ctx.in.err("unimplemented instruction");
}